

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FailoverStrategy.cpp
# Opt level: O3

void __thiscall
xmrig::FailoverStrategy::FailoverStrategy
          (FailoverStrategy *this,vector<xmrig::Pool,_std::allocator<xmrig::Pool>_> *pools,
          int retryPause,int retries,IStrategyListener *listener,bool quiet)

{
  Pool *pPVar1;
  Pool *pool;
  Pool *pool_00;
  
  (this->super_IStrategy)._vptr_IStrategy = (_func_int **)&PTR__FailoverStrategy_001ac360;
  (this->super_IClientListener)._vptr_IClientListener = (_func_int **)&DAT_001ac3e0;
  this->m_quiet = quiet;
  this->m_retries = retries;
  this->m_retryPause = retryPause;
  this->m_active = -1;
  this->m_listener = listener;
  this->m_index = 0;
  (this->m_pools).super__Vector_base<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_pools).super__Vector_base<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_pools).super__Vector_base<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar1 = (pools->super__Vector_base<xmrig::Pool,_std::allocator<xmrig::Pool>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pool_00 = (pools->super__Vector_base<xmrig::Pool,_std::allocator<xmrig::Pool>_>)._M_impl.
                 super__Vector_impl_data._M_start; pool_00 != pPVar1; pool_00 = pool_00 + 1) {
    add(this,pool_00);
  }
  return;
}

Assistant:

xmrig::FailoverStrategy::FailoverStrategy(const std::vector<Pool> &pools, int retryPause, int retries, IStrategyListener *listener, bool quiet) :
    m_quiet(quiet),
    m_retries(retries),
    m_retryPause(retryPause),
    m_active(-1),
    m_listener(listener),
    m_index(0)
{
    for (const Pool &pool : pools) {
        add(pool);
    }
}